

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InputInfo.cpp
# Opt level: O1

bool __thiscall
helics::InputInfo::addSource
          (InputInfo *this,GlobalHandle newSource,string_view sourceName,string_view stype,
          string_view sunits)

{
  pointer *ppGVar1;
  pointer pTVar2;
  pointer psVar3;
  iterator __position;
  iterator __position_00;
  bool bVar4;
  bool bVar5;
  byte in_AL;
  pointer pGVar6;
  int iVar7;
  ulong uVar8;
  GlobalHandle *is;
  pointer pGVar9;
  bool bVar10;
  GlobalHandle local_78;
  pointer local_70;
  ulong local_68;
  basic_string_view<char,_std::char_traits<char>_> local_60;
  basic_string_view<char,_std::char_traits<char>_> local_50;
  value_type local_40;
  
  local_50._M_str = sourceName._M_str;
  local_50._M_len = sourceName._M_len;
  local_60._M_str = stype._M_str;
  local_60._M_len = stype._M_len;
  pGVar9 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_start;
  pGVar6 = (this->input_sources).
           super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
           super__Vector_impl_data._M_finish;
  bVar10 = pGVar9 == pGVar6;
  local_78 = newSource;
  if (!bVar10) {
    uVar8 = 0;
    local_70 = pGVar6;
    do {
      bVar4 = local_78.handle.hid.hid == (pGVar9->handle).hid;
      bVar5 = (pGVar9->fed_id).gid == local_78.fed_id.gid.gid;
      iVar7 = (int)uVar8;
      if (bVar4 && bVar5) {
        pTVar2 = (this->deactivated).
                 super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (pTVar2[iVar7].internalTimeCode == 0x7fffffffffffffff) {
          in_AL = 0;
        }
        else {
          pTVar2[iVar7].internalTimeCode = 0x7fffffffffffffff;
          psVar3 = (this->source_info).
                   super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_68 = uVar8;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &psVar3[iVar7].units,0,psVar3[iVar7].units._M_string_length,sunits._M_str,
                     sunits._M_len);
          psVar3 = (this->source_info).
                   super__Vector_base<helics::InputInfo::sourceInformation,_std::allocator<helics::InputInfo::sourceInformation>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          CLI::std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
          _M_replace((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &psVar3[iVar7].type,0,psVar3[iVar7].type._M_string_length,sunits._M_str,
                     sunits._M_len);
          in_AL = 1;
          pGVar6 = local_70;
          uVar8 = local_68;
        }
      }
      else {
        uVar8 = (ulong)(iVar7 + 1);
      }
      if (bVar4 && bVar5) break;
      pGVar9 = pGVar9 + 1;
      bVar10 = pGVar9 == pGVar6;
    } while (!bVar10);
  }
  if (bVar10) {
    (this->inputUnits)._M_string_length = 0;
    *(this->inputUnits)._M_dataplus._M_p = '\0';
    (this->inputType)._M_string_length = 0;
    *(this->inputType)._M_dataplus._M_p = '\0';
    __position._M_current =
         (this->input_sources).
         super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
         super__Vector_impl_data._M_finish;
    if (__position._M_current ==
        (this->input_sources).
        super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>>::
      _M_realloc_insert<helics::GlobalHandle_const&>
                ((vector<helics::GlobalHandle,std::allocator<helics::GlobalHandle>> *)
                 &this->input_sources,__position,&local_78);
    }
    else {
      *__position._M_current = local_78;
      ppGVar1 = &(this->input_sources).
                 super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      *ppGVar1 = *ppGVar1 + 1;
    }
    std::
    vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
    ::
    emplace_back<std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&,std::basic_string_view<char,std::char_traits<char>>&>
              ((vector<helics::InputInfo::sourceInformation,std::allocator<helics::InputInfo::sourceInformation>>
                *)&this->source_info,&local_50,&local_60,&sunits);
    std::
    vector<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>,_std::allocator<std::vector<helics::InputInfo::dataRecord,_std::allocator<helics::InputInfo::dataRecord>_>_>_>
    ::resize(&this->data_queues,
             (long)(this->input_sources).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->input_sources).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
    std::
    vector<std::shared_ptr<const_helics::SmallBuffer>,_std::allocator<std::shared_ptr<const_helics::SmallBuffer>_>_>
    ::resize(&this->current_data,
             (long)(this->input_sources).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->input_sources).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3);
    local_40.first.internalTimeCode = -0x7fffffffffffffff;
    local_40.second = 0;
    std::
    vector<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>,_std::allocator<std::pair<TimeRepresentation<count_time<9,_long>_>,_unsigned_int>_>_>
    ::resize(&this->current_data_time,
             (long)(this->input_sources).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_finish -
             (long)(this->input_sources).
                   super__Vector_base<helics::GlobalHandle,_std::allocator<helics::GlobalHandle>_>.
                   _M_impl.super__Vector_impl_data._M_start >> 3,&local_40);
    local_40.first.internalTimeCode = 0x7fffffffffffffff;
    __position_00._M_current =
         (this->deactivated).
         super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    if (__position_00._M_current ==
        (this->deactivated).
        super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage) {
      std::
      vector<TimeRepresentation<count_time<9,long>>,std::allocator<TimeRepresentation<count_time<9,long>>>>
      ::_M_realloc_insert<TimeRepresentation<count_time<9,long>>>
                ((vector<TimeRepresentation<count_time<9,long>>,std::allocator<TimeRepresentation<count_time<9,long>>>>
                  *)&this->deactivated,__position_00,&local_40.first);
    }
    else {
      (__position_00._M_current)->internalTimeCode = 0x7fffffffffffffff;
      (this->deactivated).
      super__Vector_base<TimeRepresentation<count_time<9,_long>_>,_std::allocator<TimeRepresentation<count_time<9,_long>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish = __position_00._M_current + 1;
    }
    this->has_target = true;
    in_AL = 1;
  }
  return (bool)(in_AL & 1);
}

Assistant:

bool InputInfo::addSource(GlobalHandle newSource,
                          std::string_view sourceName,
                          std::string_view stype,
                          std::string_view sunits)
{
    int index{0};
    for (const auto& is : input_sources) {
        if (is == newSource) {
            if (deactivated[index] < Time::maxVal()) {
                // this is a reconnection
                deactivated[index] = Time::maxVal();
                source_info[index].units = sunits;
                source_info[index].type = sunits;
                return true;
            }
            return false;
        }
        ++index;
    }
    // clear this since it isn't well defined what the units are once a new source is added
    inputUnits.clear();
    inputType.clear();
    input_sources.push_back(newSource);
    source_info.emplace_back(sourceName, stype, sunits);
    data_queues.resize(input_sources.size());
    current_data.resize(input_sources.size());
    current_data_time.resize(input_sources.size(), {Time::minVal(), 0});
    deactivated.push_back(Time::maxVal());
    has_target = true;
    return true;
}